

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O2

void Curl_auth_digest_cleanup(digestdata *digest)

{
  (*Curl_cfree)(digest->nonce);
  digest->nonce = (char *)0x0;
  (*Curl_cfree)(digest->cnonce);
  digest->cnonce = (char *)0x0;
  (*Curl_cfree)(digest->realm);
  digest->realm = (char *)0x0;
  (*Curl_cfree)(digest->opaque);
  digest->opaque = (char *)0x0;
  (*Curl_cfree)(digest->qop);
  digest->qop = (char *)0x0;
  (*Curl_cfree)(digest->algorithm);
  digest->algorithm = (char *)0x0;
  digest->nc = 0;
  digest->algo = 0;
  digest->field_0x3c = digest->field_0x3c & 0xfc;
  return;
}

Assistant:

void Curl_auth_digest_cleanup(struct digestdata *digest)
{
  Curl_safefree(digest->nonce);
  Curl_safefree(digest->cnonce);
  Curl_safefree(digest->realm);
  Curl_safefree(digest->opaque);
  Curl_safefree(digest->qop);
  Curl_safefree(digest->algorithm);

  digest->nc = 0;
  digest->algo = CURLDIGESTALGO_MD5; /* default algorithm */
  digest->stale = FALSE; /* default means normal, not stale */
  digest->userhash = FALSE;
}